

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SourceTextModuleRecord.cpp
# Opt level: O3

Var Js::SourceTextModuleRecord::ResolveOrRejectDynamicImportPromise
              (bool isResolve,Var value,ScriptContext *scriptContext,
              SourceTextModuleRecord *moduleRecord,bool useReturn)

{
  bool bVar1;
  JavascriptPromise *this;
  undefined7 in_register_00000081;
  void *unaff_retaddr;
  undefined1 auStack_a8 [8];
  ScriptEntryExitRecord __entryExitRecord;
  undefined1 local_68 [8];
  EnterScriptObject __enterScriptObject;
  
  __enterScriptObject.library._4_4_ = (undefined4)CONCAT71(in_register_00000081,useReturn);
  bVar1 = scriptContext->threadContext->isScriptActive;
  if ((moduleRecord == (SourceTextModuleRecord *)0x0) ||
     (this = (moduleRecord->promise).ptr, this == (JavascriptPromise *)0x0)) {
    this = JavascriptPromise::CreateEnginePromise(scriptContext);
  }
  if (bVar1 == false) {
    __entryExitRecord.frameIdOfScriptExitFunction = (void *)0x0;
    __entryExitRecord.scriptContext = (ScriptContext *)0x0;
    __entryExitRecord.returnAddrOfScriptEntryFunction = (void *)0x0;
    __entryExitRecord.addrOfReturnAddrOfScriptEntryFunction = (void *)0x0;
    auStack_a8 = (undefined1  [8])0x0;
    __entryExitRecord._0_1_ = 0;
    __entryExitRecord.savedImplicitCallFlags = ImplicitCall_HasNoInfo;
    __entryExitRecord._2_6_ = 0;
    __entryExitRecord.next = (ScriptEntryExitRecord *)0x0;
    EnterScriptObject::EnterScriptObject
              ((EnterScriptObject *)local_68,scriptContext,(ScriptEntryExitRecord *)auStack_a8,
               unaff_retaddr,&stack0x00000000,true,false,false);
    ScriptContext::OnScriptStart(scriptContext,false,true);
    EnterScriptObject::VerifyEnterScript((EnterScriptObject *)local_68);
    if (isResolve) {
      JavascriptPromise::Resolve(this,value,scriptContext);
    }
    else {
      JavascriptPromise::Reject(this,value,scriptContext);
    }
    EnterScriptObject::~EnterScriptObject((EnterScriptObject *)local_68);
  }
  else if (isResolve) {
    JavascriptPromise::Resolve(this,value,scriptContext);
  }
  else {
    JavascriptPromise::Reject(this,value,scriptContext);
  }
  if (moduleRecord != (SourceTextModuleRecord *)0x0) {
    Memory::Recycler::WBSetBit((char *)&moduleRecord->promise);
    (moduleRecord->promise).ptr = (JavascriptPromise *)0x0;
    Memory::RecyclerWriteBarrierManager::WriteBarrier(&moduleRecord->promise);
    if ((moduleRecord->super_ModuleRecordBase).wasEvaluated == false) {
      ModuleRecordBase::SetWasEvaluated(&moduleRecord->super_ModuleRecordBase);
    }
    if (__enterScriptObject.library._4_1_ != '\0') {
      this = (JavascriptPromise *)JavascriptPromise::CreatePassThroughPromise(this,scriptContext);
    }
  }
  return this;
}

Assistant:

Var SourceTextModuleRecord::ResolveOrRejectDynamicImportPromise(bool isResolve, Var value, ScriptContext *scriptContext, SourceTextModuleRecord *moduleRecord, bool useReturn)
    {
        bool isScriptActive = scriptContext->GetThreadContext()->IsScriptActive();
        JavascriptPromise *promise = nullptr;
        if (moduleRecord != nullptr)
        {
            promise = moduleRecord->GetPromise();
        }

        if (promise == nullptr)
        {
            promise = JavascriptPromise::CreateEnginePromise(scriptContext);
        }

        ENTER_SCRIPT_IF(scriptContext, true, false, false, !isScriptActive,
        {
            if (isResolve)
            {
                promise->Resolve(value, scriptContext);
            }
            else
            {
                promise->Reject(value, scriptContext);
            }
        });

        if (moduleRecord != nullptr)
        {
            moduleRecord->SetPromise(nullptr);
            if (!moduleRecord->WasEvaluated())
            {
                moduleRecord->SetWasEvaluated();
            }
            if (useReturn)
            {
                return JavascriptPromise::CreatePassThroughPromise(promise, scriptContext);
            }
        }
        return promise;
    }